

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

ReadFileResult __thiscall
cmCMakePresetsGraph::ReadProjectPresets
          (cmCMakePresetsGraph *this,string *sourceDir,bool allowNoFiles)

{
  ReadFileResult RVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->SourceDir);
  ClearPresets(this);
  RVar1 = ReadProjectPresetsInternal(this,allowNoFiles);
  if (RVar1 != READ_OK) {
    ClearPresets(this);
  }
  return RVar1;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult cmCMakePresetsGraph::ReadProjectPresets(
  const std::string& sourceDir, bool allowNoFiles)
{
  this->SourceDir = sourceDir;
  this->ClearPresets();

  auto result = this->ReadProjectPresetsInternal(allowNoFiles);
  if (result != ReadFileResult::READ_OK) {
    this->ClearPresets();
  }

  return result;
}